

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O1

void __thiscall
agge::tests::mocks::mask<8ul>::
mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
          (mask<8ul> *this,
          pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*cells) [1],
          int y0)

{
  undefined8 *puVar1;
  cell *pcVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  *(int *)(this + 4) = y0;
  *(undefined4 *)(this + 8) = 1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  puVar1 = *(undefined8 **)(this + 0x18);
  if (puVar1 == (undefined8 *)0x0) {
    std::
    vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
    ::_M_realloc_insert((vector<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                         *)(this + 0x10),(iterator)0x0,*cells);
  }
  else {
    pcVar2 = (*cells)[0].second;
    *puVar1 = (*cells)[0].first;
    puVar1[1] = pcVar2;
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 0x10;
  }
  pcVar2 = (*cells)[0].first;
  lVar4 = (long)(*cells)[0].second - (long)pcVar2;
  if (lVar4 == 0) {
    iVar3 = 2;
  }
  else {
    lVar4 = (lVar4 >> 2) * -0x5555555555555555;
    iVar5 = 0x7fffffff;
    do {
      iVar3 = pcVar2->x;
      if (iVar3 <= iVar5) {
        iVar5 = iVar3;
      }
      pcVar2 = pcVar2 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    iVar3 = iVar3 - iVar5;
  }
  iVar5 = -1;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  *(int *)this = iVar5 + 1;
  return;
}

Assistant:

mask(const T (&cells)[n], int y0)
					: _min_y(y0), _height(n)
				{
					int min_x = 0x7FFFFFFF, max_x = -0x7FFFFFFF;

					for (int i = 0; i != n; ++i)
					{
						_cells.push_back(cells[i]);
						for (int j = 0; j != cells[i].second - cells[i].first; ++j)
						{
							min_x = agge_min(min_x, (cells[i].first + j)->x);
							max_x = agge_max(min_x, (cells[i].first + j)->x);
						}
					}
					_width = agge_max(max_x - min_x, -1) + 1;
				}